

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilterBase_init_Test::TestBody(UnscentedKalmanFilterBase_init_Test *this)

{
  DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *this_00;
  bool bVar1;
  Scalar *pSVar2;
  char *pcVar3;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_f0;
  Message local_e8 [3];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  UnscentedKalmanFilterBase_init_Test *this_local;
  
  this_00 = (DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
            ((long)&gtest_ar.message_.ptr_ + 4);
  ConcreteUKF<Kalman::Vector<float,_3>_>::ConcreteUKF
            ((ConcreteUKF<Kalman::Vector<float,_3>_> *)this_00,1.0,2.0,1.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[](this_00,0);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_d0,"0","ukf.x[0]",0.0,*pSVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(local_e8);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                        ((long)&gtest_ar.message_.ptr_ + 4),1);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)local_108,"0","ukf.x[1]",0.0,*pSVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                 ,0x1c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_110);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                          ((long)&gtest_ar.message_.ptr_ + 4),2);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)local_128,"0","ukf.x[2]",0.0,*pSVar2);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_130);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x1d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,&local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        testing::Message::~Message(&local_130);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    }
  }
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, init) {
    auto ukf = ConcreteUKF<Vector<T, 3>>(1,2,1);
    
    // x should be zero
    ASSERT_FLOAT_EQ(0, ukf.x[0]);
    ASSERT_FLOAT_EQ(0, ukf.x[1]);
    ASSERT_FLOAT_EQ(0, ukf.x[2]);
}